

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  
  pIVar2 = GImGui->CurrentWindow;
  if ((GImGui->NavDisableMouseHover == true) && (GImGui->NavDisableHighlight == false)) {
    return GImGui->NavId != 0 && GImGui->NavId == (pIVar2->DC).LastItemId;
  }
  if (((pIVar2->DC).LastItemStatusFlags & 1) != 0) {
    if (((((((flags & 0x40U) != 0) || (GImGui->HoveredRootWindow == pIVar2->RootWindow)) &&
          (((flags & 0x20U) != 0 ||
           ((((IVar1 = GImGui->ActiveId, IVar1 == 0 || (IVar1 == (pIVar2->DC).LastItemId)) ||
             (GImGui->ActiveIdAllowOverlap != false)) || (IVar1 == pIVar2->MoveId)))))) &&
         ((((GImGui->NavWindow == (ImGuiWindow *)0x0 ||
            (pIVar3 = GImGui->NavWindow->RootWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
           ((pIVar3 == pIVar2->RootWindow || (pIVar3->WasActive == false)))) ||
          ((((uint)pIVar3->Flags >> 0x1b & 1) == 0 &&
           (((flags & 8U) != 0 || ((pIVar3->Flags & 0x4000000U) == 0)))))))) &&
        (((char)flags < '\0' || (((pIVar2->DC).ItemFlags & 4U) == 0)))) &&
       (((pIVar2->DC).LastItemId != pIVar2->MoveId || (pIVar2->WriteAccessed == false)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight)
        return IsItemFocused();

    // Test for bounding box overlap, as updated as ItemAdd()
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    IM_ASSERT((flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0);   // Flags not supported by this function

    // Test if we are hovering the right window (our window could be behind another window)
    // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable to use IsItemHovered() after EndChild() itself.
    // Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was the test that has been running for a long while.
    //if (g.HoveredWindow != window)
    //    return false;
    if (g.HoveredRootWindow != window->RootWindow && !(flags & ImGuiHoveredFlags_AllowWhenOverlapped))
        return false;

    // Test if another item is active (e.g. being dragged)
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && g.ActiveId != window->DC.LastItemId && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
            return false;

    // Test if interactions on this window are blocked by an active popup or modal.
    // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
    if (!IsWindowContentHoverable(window, flags))
        return false;

    // Test if the item is disabled
    if ((window->DC.ItemFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
        return false;

    // Special handling for calling after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    if (window->DC.LastItemId == window->MoveId && window->WriteAccessed)
        return false;
    return true;
}